

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.h
# Opt level: O1

void __thiscall Database::flush(Database *this,int i)

{
  size_t __len;
  int __fd;
  int iVar1;
  void *__dest;
  long lVar2;
  ulong uVar3;
  size_t __len_00;
  __string_type __str;
  long *local_90;
  ulong local_88;
  long local_80 [2];
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  void *local_38;
  
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,A_ORDERDATE_PATH_abi_cxx11_._M_dataplus._M_p,
             A_ORDERDATE_PATH_abi_cxx11_._M_dataplus._M_p +
             A_ORDERDATE_PATH_abi_cxx11_._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  local_5c = open((char *)local_90,0x42,0x1ff);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = local_80;
  local_58 = (void *)(ulong)(uint)i;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,A_MINSHIPDATE_PATH_abi_cxx11_._M_dataplus._M_p,
             A_MINSHIPDATE_PATH_abi_cxx11_._M_dataplus._M_p +
             A_MINSHIPDATE_PATH_abi_cxx11_._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  local_68 = open((char *)local_90,0x42,0x1ff);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,A_MAXSHIPDATE_PATH_abi_cxx11_._M_dataplus._M_p,
             A_MAXSHIPDATE_PATH_abi_cxx11_._M_dataplus._M_p +
             A_MAXSHIPDATE_PATH_abi_cxx11_._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  local_60 = open((char *)local_90,0x42,0x1ff);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,A_EXTENDEDPRICESUM_PATH_abi_cxx11_._M_dataplus._M_p,
             A_EXTENDEDPRICESUM_PATH_abi_cxx11_._M_dataplus._M_p +
             A_EXTENDEDPRICESUM_PATH_abi_cxx11_._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  local_6c = open((char *)local_90,0x42,0x1ff);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,A_ORDERKEY_PATH_abi_cxx11_._M_dataplus._M_p,
             A_ORDERKEY_PATH_abi_cxx11_._M_dataplus._M_p +
             A_ORDERKEY_PATH_abi_cxx11_._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  iVar1 = open((char *)local_90,0x42,0x1ff);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,A_LINEITEMPOSITION_PATH_abi_cxx11_._M_dataplus._M_p,
             A_LINEITEMPOSITION_PATH_abi_cxx11_._M_dataplus._M_p +
             A_LINEITEMPOSITION_PATH_abi_cxx11_._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  local_64 = open((char *)local_90,0x42,0x1ff);
  local_70 = iVar1;
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  __fd = local_5c;
  lVar2 = (long)(int)local_58;
  uVar3 = (ulong)(*this->a_orderkey[lVar2] + 1);
  __len = uVar3 * 2;
  fallocate(local_5c,0,0,__len);
  fallocate(local_68,0,0,__len);
  iVar1 = local_60;
  fallocate(local_60,0,0,__len);
  __len_00 = uVar3 << 2;
  fallocate(local_6c,0,0,__len_00);
  fallocate(local_70,0,0,__len_00);
  fallocate(local_64,0,0,__len_00);
  local_58 = mmap((void *)0x0,__len,3,1,__fd,0);
  local_38 = mmap((void *)0x0,__len,3,1,local_68,0);
  local_40 = mmap((void *)0x0,__len,3,1,iVar1,0);
  local_48 = mmap((void *)0x0,__len_00,3,1,local_6c,0);
  local_50 = mmap((void *)0x0,__len_00,3,1,local_70,0);
  iVar1 = local_64;
  __dest = mmap((void *)0x0,__len_00,3,1,local_64,0);
  memcpy(local_58,this->a_orderdate[lVar2],__len);
  memcpy(local_38,this->a_minshipdate[lVar2],__len);
  memcpy(local_40,this->a_maxshipdate[lVar2],__len);
  memcpy(local_48,this->a_extendedpricesum[lVar2],__len_00);
  memcpy(local_50,this->a_orderkey[lVar2],__len_00);
  memcpy(__dest,this->a_lineitemposition[lVar2],__len_00);
  close(local_5c);
  close(local_68);
  close(local_60);
  close(local_6c);
  close(local_70);
  close(iVar1);
  LOCK();
  (this->pending).super___atomic_base<unsigned_char>._M_i =
       (this->pending).super___atomic_base<unsigned_char>._M_i + 0xff;
  UNLOCK();
  return;
}

Assistant:

void Database::flush(int i) {

  auto a_orderdate_fd = open((A_ORDERDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_minshipdate_fd = open((A_MINSHIPDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_maxshipdate_fd = open((A_MAXSHIPDATE_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_extendedpricesum_fd = open((A_EXTENDEDPRICESUM_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_orderkey_fd = open((A_ORDERKEY_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);
  auto a_lineitemposition_fd = open((A_LINEITEMPOSITION_PATH + util::IntToChar(i)).c_str(), O_RDWR | O_CREAT, 0777);

  auto size = a_orderkey[i][0] + 1;

  fallocate(a_orderdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_minshipdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_maxshipdate_fd, 0, 0, size * sizeof(uint16_t));
  fallocate(a_extendedpricesum_fd, 0, 0, size * sizeof(uint32_t));
  fallocate(a_orderkey_fd, 0, 0, size * sizeof(uint32_t));
  fallocate(a_lineitemposition_fd, 0, 0, size * sizeof(uint32_t));

  auto a_orderdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_orderdate_fd, 0);
  auto a_minshipdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_minshipdate_fd, 0);
  auto a_maxshipdate_mmap = (uint16_t*) mmap(nullptr, size * sizeof(uint16_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_maxshipdate_fd, 0);
  auto a_extendedpricesum_mmap = (uint32_t *) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_extendedpricesum_fd, 0);
  auto a_orderkey_mmap = (uint32_t*) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_orderkey_fd, 0);
  auto a_lineitemposition_mmap = (uint32_t*) mmap(nullptr, size * sizeof(uint32_t), PROT_READ | PROT_WRITE, MAP_SHARED, a_lineitemposition_fd, 0);

  memcpy(a_orderdate_mmap, a_orderdate[i], size * sizeof(uint16_t));
  memcpy(a_minshipdate_mmap, a_minshipdate[i], size * sizeof(uint16_t));
  memcpy(a_maxshipdate_mmap, a_maxshipdate[i], size * sizeof(uint16_t));
  memcpy(a_extendedpricesum_mmap, a_extendedpricesum[i], size * sizeof(uint32_t));
  memcpy(a_orderkey_mmap, a_orderkey[i], size * sizeof(uint32_t));
  memcpy(a_lineitemposition_mmap, a_lineitemposition[i], size * sizeof(uint32_t));

  close(a_orderdate_fd);
  close(a_minshipdate_fd);
  close(a_maxshipdate_fd);
  close(a_extendedpricesum_fd);
  close(a_orderkey_fd);
  close(a_lineitemposition_fd);

  --pending;
}